

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O1

_Bool Curl_rtsp_connisdead(connectdata *check)

{
  uint uVar1;
  curl_socket_t cVar2;
  connectdata *in_RDI;
  _Bool _Var3;
  connectdata *local_10;
  
  _Var3 = false;
  local_10 = in_RDI;
  uVar1 = Curl_socket_check(in_RDI->sock[0],-1,-1,0);
  if (((uVar1 != 0) && (_Var3 = true, (uVar1 & 5) == 1)) && (local_10->data != (Curl_easy *)0x0)) {
    cVar2 = Curl_getconnectinfo(local_10->data,&local_10);
    _Var3 = cVar2 == -1;
  }
  return _Var3;
}

Assistant:

bool Curl_rtsp_connisdead(struct connectdata *check)
{
  int sval;
  bool ret_val = TRUE;

  sval = Curl_socket_ready(check->sock[FIRSTSOCKET], CURL_SOCKET_BAD, 0);
  if(sval == 0) {
    /* timeout */
    ret_val = FALSE;
  }
  else if(sval & CURL_CSELECT_ERR) {
    /* socket is in an error state */
    ret_val = TRUE;
  }
  else if((sval & CURL_CSELECT_IN) && check->data) {
    /* readable with no error. could be closed or could be alive but we can
       only check if we have a proper Curl_easy for the connection */
    curl_socket_t connectinfo = Curl_getconnectinfo(check->data, &check);
    if(connectinfo != CURL_SOCKET_BAD)
      ret_val = FALSE;
  }

  return ret_val;
}